

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_type_fracdigits
                 (lysp_ctx *ctx,lysp_stmt *stmt,uint8_t *fracdig,lysp_ext_instance **exts)

{
  char cVar1;
  lysp_stmt *stmt_00;
  LY_ERR LVar2;
  size_t sVar3;
  ushort **ppuVar4;
  int *piVar5;
  ulonglong uVar6;
  char *pcVar7;
  char *format;
  ly_ctx *plVar8;
  lysp_stmt **pplVar9;
  char *ptr;
  
  if (*fracdig == '\0') {
    LVar2 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    pcVar7 = stmt->arg;
    sVar3 = strlen(pcVar7);
    if ((((int)sVar3 == 0) || (cVar1 = *pcVar7, (long)cVar1 == 0x30)) ||
       (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 8) == 0)) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      format = "Invalid value \"%.*s\" of \"%s\".";
    }
    else {
      piVar5 = __errno_location();
      *piVar5 = 0;
      uVar6 = strtoull(pcVar7,&ptr,10);
      pcVar7 = stmt->arg;
      if ((long)ptr - (long)pcVar7 == (long)(int)sVar3) {
        if (uVar6 < 0x13 && *piVar5 != 0x22) {
          *fracdig = (uint8_t)uVar6;
          pplVar9 = &stmt->child;
          while( true ) {
            stmt_00 = *pplVar9;
            if (stmt_00 == (lysp_stmt *)0x0) {
              return LY_SUCCESS;
            }
            if (stmt_00->kw != LY_STMT_EXTENSION_INSTANCE) break;
            LVar2 = lysp_stmt_ext(ctx,stmt_00,LY_STMT_FRACTION_DIGITS,0,exts);
            pplVar9 = &stmt_00->next;
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
          }
          if (ctx == (lysp_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar7 = lyplg_ext_stmt2str(stmt_00->kw);
          ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\" as a child of \"%s\"."
                  ,pcVar7,"fraction-digits");
          return LY_EVALID;
        }
        if (ctx == (lysp_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        format = "Value \"%.*s\" is out of \"%s\" bounds.";
      }
      else {
        if (ctx == (lysp_ctx *)0x0) {
          plVar8 = (ly_ctx *)0x0;
        }
        else {
          plVar8 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        format = "Invalid value \"%.*s\" of \"%s\".";
      }
    }
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,sVar3,pcVar7,"fraction-digits");
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      plVar8 = (ly_ctx *)0x0;
    }
    else {
      plVar8 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","fraction-digits");
  }
  return LY_EVALID;
}

Assistant:

static LY_ERR
lysp_stmt_type_fracdigits(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, uint8_t *fracdig,
        struct lysp_ext_instance **exts)
{
    char *ptr;
    int arg_len;
    unsigned long long num;

    if (*fracdig) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "fraction-digits");
        return LY_EVALID;
    }

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));
    arg_len = strlen(stmt->arg);
    if (!arg_len || (stmt->arg[0] == '0') || !isdigit(stmt->arg[0])) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "fraction-digits");
        return LY_EVALID;
    }

    errno = 0;
    num = strtoull(stmt->arg, &ptr, LY_BASE_DEC);
    /* we have not parsed the whole argument */
    if (ptr - stmt->arg != arg_len) {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, arg_len, stmt->arg, "fraction-digits");
        return LY_EVALID;
    }
    if ((errno == ERANGE) || (num > LY_TYPE_DEC64_FD_MAX)) {
        LOGVAL_PARSER(ctx, LY_VCODE_OOB, arg_len, stmt->arg, "fraction-digits");
        return LY_EVALID;
    }
    *fracdig = num;

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_FRACTION_DIGITS, 0, exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "fraction-digits");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}